

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

IRet * __thiscall
vkt::shaderexecutor::Functions::GetComponent<tcu::Matrix<float,_2,_2>_>::doApply
          (IRet *__return_storage_ptr__,GetComponent<tcu::Matrix<float,_2,_2>_> *this,
          EvalContext *param_1,IArgs *iargs)

{
  bool bVar1;
  long lVar2;
  bool bVar3;
  undefined8 local_50;
  double dStack_48;
  double local_40;
  undefined8 uStack_38;
  double local_30;
  double dStack_28;
  
  lVar2 = 0;
  __return_storage_ptr__->m_data[0].m_hasNaN = false;
  __return_storage_ptr__->m_data[0].m_lo = INFINITY;
  __return_storage_ptr__->m_data[0].m_hi = -INFINITY;
  __return_storage_ptr__->m_data[1].m_hasNaN = false;
  __return_storage_ptr__->m_data[1].m_lo = INFINITY;
  __return_storage_ptr__->m_data[1].m_hi = -INFINITY;
  bVar1 = true;
  do {
    bVar3 = bVar1;
    if ((iargs->b->m_lo <= (double)(int)lVar2) && ((double)(int)lVar2 <= iargs->b->m_hi)) {
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doUnion
                (__return_storage_ptr__,(iargs->a->m_data).m_data + lVar2);
      __return_storage_ptr__->m_data[1].m_lo = local_30;
      __return_storage_ptr__->m_data[1].m_hi = dStack_28;
      __return_storage_ptr__->m_data[0].m_hi = local_40;
      *(undefined8 *)(__return_storage_ptr__->m_data + 1) = uStack_38;
      *(undefined8 *)__return_storage_ptr__->m_data = local_50;
      __return_storage_ptr__->m_data[0].m_lo = dStack_48;
    }
    lVar2 = 1;
    bVar1 = false;
  } while (bVar3);
  return __return_storage_ptr__;
}

Assistant:

IRet		doApply		(const EvalContext&,
							 const typename GetComponent::IArgs& iargs) const
	{
		IRet ret;

		for (int compNdx = 0; compNdx < T::SIZE; ++compNdx)
		{
			if (iargs.b.contains(compNdx))
				ret = unionIVal<typename T::Element>(ret, iargs.a[compNdx]);
		}

		return ret;
	}